

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O0

void bsp_get_boundaries(void *handle,float *boundaries)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  long *in_RDI;
  int max;
  int min;
  int cnt;
  int j;
  int i;
  bsp_tree *tree;
  int local_20;
  int local_1c;
  
  iVar3 = array_count(*(void **)*in_RDI);
  if (0 < iVar3) {
    for (local_20 = 0; local_20 < (int)(uint)*(byte *)(in_RDI + 1); local_20 = local_20 + 1) {
      *(undefined4 *)(in_RSI + (long)(local_20 << 1) * 4) =
           **(undefined4 **)(*in_RDI + (long)local_20 * 8);
      *(undefined4 *)(in_RSI + (long)(local_20 * 2 + 1) * 4) =
           **(undefined4 **)(*in_RDI + (long)local_20 * 8);
    }
    for (local_20 = 0; local_20 < (int)(uint)*(byte *)(in_RDI + 1); local_20 = local_20 + 1) {
      iVar4 = local_20 * 2 + 1;
      for (local_1c = 1; local_1c < iVar3; local_1c = local_1c + 1) {
        fVar2 = *(float *)(in_RSI + (long)(local_20 << 1) * 4);
        pfVar1 = (float *)(*(long *)(*in_RDI + (long)local_20 * 8) + (long)local_1c * 4);
        if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
          if (*(float *)(in_RSI + (long)iVar4 * 4) <
              *(float *)(*(long *)(*in_RDI + (long)local_20 * 8) + (long)local_1c * 4)) {
            *(undefined4 *)(in_RSI + (long)iVar4 * 4) =
                 *(undefined4 *)(*(long *)(*in_RDI + (long)local_20 * 8) + (long)local_1c * 4);
          }
        }
        else {
          *(undefined4 *)(in_RSI + (long)(local_20 << 1) * 4) =
               *(undefined4 *)(*(long *)(*in_RDI + (long)local_20 * 8) + (long)local_1c * 4);
        }
      }
    }
  }
  return;
}

Assistant:

void
bsp_get_boundaries(
    void * handle,
    float * boundaries )
{
    bsp_tree * tree;
    int i, j, cnt;
    tree = (bsp_tree *) handle;
    assert( tree != NULL );
    assert( tree->pointarrays != NULL );
    assert( tree->pointarrays[0] != NULL );
    if ( (cnt = array_count( tree->pointarrays[0] )) > 0 ) {
        for ( j = 0; j < tree->dimensions; j++ ) {
            boundaries[j*2] = tree->pointarrays[j][0];
            boundaries[j*2+1] = tree->pointarrays[j][0];
        }
        for ( j = 0; j < tree->dimensions; j++ ) {
            int min, max;
            min = j*2;
            max = j*2+1;
            for ( i = 1; i < cnt; i++ ) {
                /* MIN() */
                if ( boundaries[min] > tree->pointarrays[j][i] )
                    boundaries[min] = tree->pointarrays[j][i];
                /* MAX() */
                else if ( boundaries[max] < tree->pointarrays[j][i] )
                    boundaries[max] = tree->pointarrays[j][i];
            }
        }
    }
}